

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::AffineTransform::backward_impl
          (AffineTransform *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  uint uVar2;
  pointer ppTVar3;
  float *pfVar4;
  Tensor *pTVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  ActualDstType actualDst;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  Index index_1;
  long lVar22;
  Index index;
  uint uVar23;
  uint uVar24;
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  int iVar45;
  int iVar46;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_78;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_58;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_58 = xs;
  if ((ulong)((long)(xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <= (ulong)i) {
    __assert_fail("i < xs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x625,
                  "virtual void cnn::AffineTransform::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (i == 0) {
    if ((fx->d).bd != 1) {
      __assert_fail("fx.d.bd == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x62a,
                    "virtual void cnn::AffineTransform::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)(dEdxi->d).bd;
    uVar23 = (dEdf->d).bd;
    if ((ulong)local_98.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value < 2 || uVar23 != 1) {
      uVar23 = (dEdxi->d).bd;
      if (uVar23 != 0) {
        uVar12 = 0;
        auVar33 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          uVar24 = (dEdf->d).nd;
          iVar46 = 1;
          iVar45 = 1;
          if ((ulong)uVar24 != 0) {
            auVar36 = vpbroadcastq_avx512f();
            uVar14 = 0;
            auVar37 = vmovdqa64_avx512f(auVar33);
            do {
              auVar38 = vmovdqa64_avx512f(auVar37);
              auVar37 = vpbroadcastq_avx512f();
              auVar30 = vporq_avx512f(auVar37,auVar34);
              auVar37 = vporq_avx512f(auVar37,auVar35);
              uVar9 = vpcmpuq_avx512f(auVar37,auVar36,2);
              bVar10 = (byte)uVar9;
              uVar9 = vpcmpuq_avx512f(auVar30,auVar36,2);
              bVar11 = (byte)uVar9;
              uVar25 = CONCAT11(bVar11,bVar10);
              auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar14));
              auVar30._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar37._4_4_;
              auVar30._0_4_ = (uint)(bVar10 & 1) * auVar37._0_4_;
              auVar30._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar37._8_4_;
              auVar30._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar37._12_4_;
              auVar30._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar37._16_4_;
              auVar30._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar37._20_4_;
              auVar30._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar37._24_4_;
              auVar30._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar37._28_4_;
              auVar30._32_4_ = (uint)(bVar11 & 1) * auVar37._32_4_;
              auVar30._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar37._36_4_;
              auVar30._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar37._40_4_;
              auVar30._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar37._44_4_;
              auVar30._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar37._48_4_;
              auVar30._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar37._52_4_;
              auVar30._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar37._56_4_;
              auVar30._60_4_ = (uint)(bVar11 >> 7) * auVar37._60_4_;
              auVar37 = vpmulld_avx512f(auVar30,auVar38);
              uVar14 = uVar14 + 0x10;
            } while (((ulong)uVar24 + 0xf & 0x1fffffff0) != uVar14);
            auVar36 = vmovdqa32_avx512f(auVar37);
            auVar37._0_4_ =
                 (uint)(bVar10 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar38._0_4_;
            bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar37._4_4_ = (uint)bVar6 * auVar36._4_4_ | (uint)!bVar6 * auVar38._4_4_;
            bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar37._8_4_ = (uint)bVar6 * auVar36._8_4_ | (uint)!bVar6 * auVar38._8_4_;
            bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar37._12_4_ = (uint)bVar6 * auVar36._12_4_ | (uint)!bVar6 * auVar38._12_4_;
            bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar37._16_4_ = (uint)bVar6 * auVar36._16_4_ | (uint)!bVar6 * auVar38._16_4_;
            bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar37._20_4_ = (uint)bVar6 * auVar36._20_4_ | (uint)!bVar6 * auVar38._20_4_;
            bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar37._24_4_ = (uint)bVar6 * auVar36._24_4_ | (uint)!bVar6 * auVar38._24_4_;
            bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
            auVar37._28_4_ = (uint)bVar6 * auVar36._28_4_ | (uint)!bVar6 * auVar38._28_4_;
            auVar37._32_4_ =
                 (uint)(bVar11 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar38._32_4_;
            bVar6 = (bool)(bVar11 >> 1 & 1);
            auVar37._36_4_ = (uint)bVar6 * auVar36._36_4_ | (uint)!bVar6 * auVar38._36_4_;
            bVar6 = (bool)(bVar11 >> 2 & 1);
            auVar37._40_4_ = (uint)bVar6 * auVar36._40_4_ | (uint)!bVar6 * auVar38._40_4_;
            bVar6 = (bool)(bVar11 >> 3 & 1);
            auVar37._44_4_ = (uint)bVar6 * auVar36._44_4_ | (uint)!bVar6 * auVar38._44_4_;
            bVar6 = (bool)(bVar11 >> 4 & 1);
            auVar37._48_4_ = (uint)bVar6 * auVar36._48_4_ | (uint)!bVar6 * auVar38._48_4_;
            bVar6 = (bool)(bVar11 >> 5 & 1);
            auVar37._52_4_ = (uint)bVar6 * auVar36._52_4_ | (uint)!bVar6 * auVar38._52_4_;
            bVar6 = (bool)(bVar11 >> 6 & 1);
            auVar37._56_4_ = (uint)bVar6 * auVar36._56_4_ | (uint)!bVar6 * auVar38._56_4_;
            auVar37._60_4_ =
                 (uint)(bVar11 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar38._60_4_;
            auVar26 = vextracti64x4_avx512f(auVar37,1);
            auVar36 = vpmulld_avx512f(auVar37,ZEXT3264(auVar26));
            auVar7 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
            auVar8 = vpshufd_avx(auVar7,0xee);
            auVar7 = vpmulld_avx(auVar7,auVar8);
            auVar8 = vpshufd_avx(auVar7,0x55);
            auVar7 = vpmulld_avx(auVar7,auVar8);
            iVar45 = auVar7._0_4_;
          }
          uVar15 = 1;
          if (1 < uVar24) {
            uVar15 = (dEdf->d).d[1];
          }
          pfVar4 = dEdf->v;
          uVar24 = (dEdxi->d).nd;
          if ((ulong)uVar24 != 0) {
            auVar36 = vpbroadcastq_avx512f();
            uVar14 = 0;
            auVar37 = vmovdqa64_avx512f(auVar33);
            do {
              auVar38 = vmovdqa64_avx512f(auVar37);
              auVar37 = vpbroadcastq_avx512f();
              auVar30 = vporq_avx512f(auVar37,auVar34);
              auVar37 = vporq_avx512f(auVar37,auVar35);
              uVar9 = vpcmpuq_avx512f(auVar37,auVar36,2);
              bVar10 = (byte)uVar9;
              uVar9 = vpcmpuq_avx512f(auVar30,auVar36,2);
              bVar11 = (byte)uVar9;
              uVar25 = CONCAT11(bVar11,bVar10);
              auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar14));
              auVar31._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar37._4_4_;
              auVar31._0_4_ = (uint)(bVar10 & 1) * auVar37._0_4_;
              auVar31._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar37._8_4_;
              auVar31._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar37._12_4_;
              auVar31._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar37._16_4_;
              auVar31._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar37._20_4_;
              auVar31._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar37._24_4_;
              auVar31._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar37._28_4_;
              auVar31._32_4_ = (uint)(bVar11 & 1) * auVar37._32_4_;
              auVar31._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar37._36_4_;
              auVar31._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar37._40_4_;
              auVar31._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar37._44_4_;
              auVar31._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar37._48_4_;
              auVar31._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar37._52_4_;
              auVar31._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar37._56_4_;
              auVar31._60_4_ = (uint)(bVar11 >> 7) * auVar37._60_4_;
              auVar37 = vpmulld_avx512f(auVar31,auVar38);
              uVar14 = uVar14 + 0x10;
            } while (((ulong)uVar24 + 0xf & 0x1fffffff0) != uVar14);
            auVar36 = vmovdqa32_avx512f(auVar37);
            auVar32._0_4_ =
                 (uint)(bVar10 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar38._0_4_;
            bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar32._4_4_ = (uint)bVar6 * auVar36._4_4_ | (uint)!bVar6 * auVar38._4_4_;
            bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar32._8_4_ = (uint)bVar6 * auVar36._8_4_ | (uint)!bVar6 * auVar38._8_4_;
            bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar32._12_4_ = (uint)bVar6 * auVar36._12_4_ | (uint)!bVar6 * auVar38._12_4_;
            bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar32._16_4_ = (uint)bVar6 * auVar36._16_4_ | (uint)!bVar6 * auVar38._16_4_;
            bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar32._20_4_ = (uint)bVar6 * auVar36._20_4_ | (uint)!bVar6 * auVar38._20_4_;
            bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar32._24_4_ = (uint)bVar6 * auVar36._24_4_ | (uint)!bVar6 * auVar38._24_4_;
            bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
            auVar32._28_4_ = (uint)bVar6 * auVar36._28_4_ | (uint)!bVar6 * auVar38._28_4_;
            auVar32._32_4_ =
                 (uint)(bVar11 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar38._32_4_;
            bVar6 = (bool)(bVar11 >> 1 & 1);
            auVar32._36_4_ = (uint)bVar6 * auVar36._36_4_ | (uint)!bVar6 * auVar38._36_4_;
            bVar6 = (bool)(bVar11 >> 2 & 1);
            auVar32._40_4_ = (uint)bVar6 * auVar36._40_4_ | (uint)!bVar6 * auVar38._40_4_;
            bVar6 = (bool)(bVar11 >> 3 & 1);
            auVar32._44_4_ = (uint)bVar6 * auVar36._44_4_ | (uint)!bVar6 * auVar38._44_4_;
            bVar6 = (bool)(bVar11 >> 4 & 1);
            auVar32._48_4_ = (uint)bVar6 * auVar36._48_4_ | (uint)!bVar6 * auVar38._48_4_;
            bVar6 = (bool)(bVar11 >> 5 & 1);
            auVar32._52_4_ = (uint)bVar6 * auVar36._52_4_ | (uint)!bVar6 * auVar38._52_4_;
            bVar6 = (bool)(bVar11 >> 6 & 1);
            auVar32._56_4_ = (uint)bVar6 * auVar36._56_4_ | (uint)!bVar6 * auVar38._56_4_;
            auVar32._60_4_ =
                 (uint)(bVar11 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar38._60_4_;
            auVar26 = vextracti64x4_avx512f(auVar32,1);
            auVar36 = vpmulld_avx512f(auVar32,ZEXT3264(auVar26));
            auVar7 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
            auVar8 = vpshufd_avx(auVar7,0xee);
            auVar7 = vpmulld_avx(auVar7,auVar8);
            auVar8 = vpshufd_avx(auVar7,0x55);
            auVar7 = vpmulld_avx(auVar7,auVar8);
            iVar46 = auVar7._0_4_;
          }
          uVar2 = (dEdxi->d).d[0];
          uVar16 = 1;
          if (1 < uVar24) {
            uVar16 = (dEdxi->d).d[1];
          }
          if ((uVar2 != (dEdf->d).d[0]) || (uVar16 != uVar15)) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                         );
          }
          pfVar1 = dEdxi->v + (uVar12 % uVar23) * iVar46;
          uVar18 = (ulong)uVar16 * (ulong)uVar2;
          uVar14 = uVar18;
          if ((((ulong)pfVar1 & 3) == 0) &&
             (uVar14 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf),
             (long)uVar18 <= (long)uVar14)) {
            uVar14 = uVar18;
          }
          uVar23 = (uVar12 % (dEdf->d).bd) * iVar45;
          uVar19 = uVar18 - uVar14;
          uVar21 = uVar19 + 0xf;
          if (-1 < (long)uVar19) {
            uVar21 = uVar19;
          }
          if (0 < (long)uVar14) {
            lVar22 = 0;
            uVar17 = uVar14;
            do {
              pfVar1[lVar22] = pfVar1[lVar22] + pfVar4[(ulong)uVar23 + lVar22];
              lVar22 = lVar22 + 1;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          lVar22 = (uVar21 & 0xfffffffffffffff0) + uVar14;
          if (0xf < (long)uVar19) {
            do {
              auVar36 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar1 + uVar14),
                                       *(undefined1 (*) [64])(pfVar4 + uVar23 + uVar14));
              *(undefined1 (*) [64])(pfVar1 + uVar14) = auVar36;
              uVar14 = uVar14 + 0x10;
            } while ((long)uVar14 < lVar22);
          }
          if (lVar22 < (long)uVar18) {
            lVar20 = (long)uVar19 % 0x10;
            do {
              pfVar1[lVar22] = pfVar1[lVar22] + pfVar4[(ulong)uVar23 + lVar22];
              lVar22 = lVar22 + 1;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
          }
          uVar12 = uVar12 + 1;
          uVar23 = (dEdxi->d).bd;
        } while (uVar12 < uVar23);
      }
    }
    else {
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v;
      uVar14 = (ulong)(dEdf->d).nd;
      uVar12 = 1;
      iVar45 = 1;
      if (uVar14 != 0) {
        auVar33 = vpbroadcastq_avx512f();
        auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
        uVar18 = 0;
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar37 = vmovdqa64_avx512f(auVar34);
          auVar34 = vpbroadcastq_avx512f();
          auVar38 = vporq_avx512f(auVar34,auVar35);
          auVar34 = vporq_avx512f(auVar34,auVar36);
          uVar9 = vpcmpuq_avx512f(auVar34,auVar33,2);
          bVar10 = (byte)uVar9;
          uVar9 = vpcmpuq_avx512f(auVar38,auVar33,2);
          bVar11 = (byte)uVar9;
          uVar25 = CONCAT11(bVar11,bVar10);
          auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar18));
          auVar38._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar34._4_4_;
          auVar38._0_4_ = (uint)(bVar10 & 1) * auVar34._0_4_;
          auVar38._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar34._8_4_;
          auVar38._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar34._12_4_;
          auVar38._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar34._16_4_;
          auVar38._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar34._20_4_;
          auVar38._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar34._24_4_;
          auVar38._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar34._28_4_;
          auVar38._32_4_ = (uint)(bVar11 & 1) * auVar34._32_4_;
          auVar38._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar34._36_4_;
          auVar38._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar34._40_4_;
          auVar38._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar34._44_4_;
          auVar38._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar34._48_4_;
          auVar38._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar34._52_4_;
          auVar38._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar34._56_4_;
          auVar38._60_4_ = (uint)(bVar11 >> 7) * auVar34._60_4_;
          auVar34 = vpmulld_avx512f(auVar38,auVar37);
          uVar18 = uVar18 + 0x10;
        } while ((uVar14 + 0xf & 0xfffffffffffffff0) != uVar18);
        auVar33 = vmovdqa32_avx512f(auVar34);
        auVar34._0_4_ =
             (uint)(bVar10 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
        bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar6 * auVar33._4_4_ | (uint)!bVar6 * auVar37._4_4_;
        bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar6 * auVar33._8_4_ | (uint)!bVar6 * auVar37._8_4_;
        bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar6 * auVar33._12_4_ | (uint)!bVar6 * auVar37._12_4_;
        bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar6 * auVar33._16_4_ | (uint)!bVar6 * auVar37._16_4_;
        bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar6 * auVar33._20_4_ | (uint)!bVar6 * auVar37._20_4_;
        bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar6 * auVar33._24_4_ | (uint)!bVar6 * auVar37._24_4_;
        bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
        auVar34._28_4_ = (uint)bVar6 * auVar33._28_4_ | (uint)!bVar6 * auVar37._28_4_;
        auVar34._32_4_ =
             (uint)(bVar11 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
        bVar6 = (bool)(bVar11 >> 1 & 1);
        auVar34._36_4_ = (uint)bVar6 * auVar33._36_4_ | (uint)!bVar6 * auVar37._36_4_;
        bVar6 = (bool)(bVar11 >> 2 & 1);
        auVar34._40_4_ = (uint)bVar6 * auVar33._40_4_ | (uint)!bVar6 * auVar37._40_4_;
        bVar6 = (bool)(bVar11 >> 3 & 1);
        auVar34._44_4_ = (uint)bVar6 * auVar33._44_4_ | (uint)!bVar6 * auVar37._44_4_;
        bVar6 = (bool)(bVar11 >> 4 & 1);
        auVar34._48_4_ = (uint)bVar6 * auVar33._48_4_ | (uint)!bVar6 * auVar37._48_4_;
        bVar6 = (bool)(bVar11 >> 5 & 1);
        auVar34._52_4_ = (uint)bVar6 * auVar33._52_4_ | (uint)!bVar6 * auVar37._52_4_;
        bVar6 = (bool)(bVar11 >> 6 & 1);
        auVar34._56_4_ = (uint)bVar6 * auVar33._56_4_ | (uint)!bVar6 * auVar37._56_4_;
        auVar34._60_4_ =
             (uint)(bVar11 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
        auVar26 = vextracti64x4_avx512f(auVar34,1);
        auVar33 = vpmulld_avx512f(auVar34,ZEXT3264(auVar26));
        auVar7 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
        auVar8 = vpshufd_avx(auVar7,0xee);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        auVar8 = vpshufd_avx(auVar7,0x55);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        iVar45 = auVar7._0_4_;
      }
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(iVar45 * uVar23);
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v;
      if (1 < (dEdxi->d).nd) {
        uVar12 = (dEdxi->d).d[1];
      }
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(uVar12 * (dEdxi->d).d[0]);
      Eigen::VectorwiseOp<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,0>::
      operator+=((VectorwiseOp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,0>
                  *)&local_98,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_b8);
    }
  }
  else if ((i & 1) == 0) {
    uVar24 = i - 1;
    uVar23 = (ppTVar3[uVar24]->d).bd;
    uVar12 = (dEdf->d).bd;
    if (uVar12 < uVar23) {
      uVar12 = uVar23;
    }
    if (uVar23 == 1) {
      Tensor::operator*(&local_b8,ppTVar3[uVar24]);
      local_78.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v;
      local_78.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdf->d).d[0];
      uVar23 = 1;
      if (1 < (dEdf->d).nd) {
        uVar23 = (dEdf->d).d[1];
      }
      local_78.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(uVar23 * (dEdf->d).bd);
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_b8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_b8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_b8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      if (local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value !=
          local_78.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value) {
LAB_00183419:
        pcVar13 = 
        "Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
        ;
LAB_0018342e:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar13);
      }
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v;
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdxi->d).d[0];
      uVar23 = 1;
      if (1 < (dEdxi->d).nd) {
        uVar23 = (dEdxi->d).d[1];
      }
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(uVar23 * (dEdxi->d).bd);
      if ((local_b8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value !=
           local_50.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value) ||
         (local_78.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value !=
          local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) {
LAB_0018343b:
        pcVar13 = 
        "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
        ;
LAB_00183450:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar13);
      }
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_50,
                 (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_98,&local_78);
    }
    else if (0 < (int)uVar12) {
      uVar23 = 0;
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pTVar5 = (local_58->
                 super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar24];
        uVar15 = (pTVar5->d).nd;
        iVar45 = 1;
        if ((ulong)uVar15 != 0) {
          auVar35 = vpbroadcastq_avx512f();
          uVar14 = 0;
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar37 = vmovdqa64_avx512f(auVar36);
            auVar36 = vpbroadcastq_avx512f();
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar9 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar10 = (byte)uVar9;
            uVar9 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar11 = (byte)uVar9;
            uVar25 = CONCAT11(bVar11,bVar10);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar5->d).d + uVar14));
            auVar39._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar36._4_4_;
            auVar39._0_4_ = (uint)(bVar10 & 1) * auVar36._0_4_;
            auVar39._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar36._8_4_;
            auVar39._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar36._12_4_;
            auVar39._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar36._16_4_;
            auVar39._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar36._20_4_;
            auVar39._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar36._24_4_;
            auVar39._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar36._28_4_;
            auVar39._32_4_ = (uint)(bVar11 & 1) * auVar36._32_4_;
            auVar39._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar36._36_4_;
            auVar39._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar36._40_4_;
            auVar39._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar36._44_4_;
            auVar39._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar36._48_4_;
            auVar39._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar36._52_4_;
            auVar39._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar36._56_4_;
            auVar39._60_4_ = (uint)(bVar11 >> 7) * auVar36._60_4_;
            auVar36 = vpmulld_avx512f(auVar39,auVar37);
            uVar14 = uVar14 + 0x10;
          } while (((ulong)uVar15 + 0xf & 0x1fffffff0) != uVar14);
          auVar35 = vmovdqa32_avx512f(auVar36);
          auVar40._0_4_ =
               (uint)(bVar10 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar6 * auVar35._4_4_ | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar6 * auVar35._8_4_ | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * auVar37._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar40._16_4_ = (uint)bVar6 * auVar35._16_4_ | (uint)!bVar6 * auVar37._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar40._20_4_ = (uint)bVar6 * auVar35._20_4_ | (uint)!bVar6 * auVar37._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar40._24_4_ = (uint)bVar6 * auVar35._24_4_ | (uint)!bVar6 * auVar37._24_4_;
          bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar40._28_4_ = (uint)bVar6 * auVar35._28_4_ | (uint)!bVar6 * auVar37._28_4_;
          auVar40._32_4_ =
               (uint)(bVar11 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
          bVar6 = (bool)(bVar11 >> 1 & 1);
          auVar40._36_4_ = (uint)bVar6 * auVar35._36_4_ | (uint)!bVar6 * auVar37._36_4_;
          bVar6 = (bool)(bVar11 >> 2 & 1);
          auVar40._40_4_ = (uint)bVar6 * auVar35._40_4_ | (uint)!bVar6 * auVar37._40_4_;
          bVar6 = (bool)(bVar11 >> 3 & 1);
          auVar40._44_4_ = (uint)bVar6 * auVar35._44_4_ | (uint)!bVar6 * auVar37._44_4_;
          bVar6 = (bool)(bVar11 >> 4 & 1);
          auVar40._48_4_ = (uint)bVar6 * auVar35._48_4_ | (uint)!bVar6 * auVar37._48_4_;
          bVar6 = (bool)(bVar11 >> 5 & 1);
          auVar40._52_4_ = (uint)bVar6 * auVar35._52_4_ | (uint)!bVar6 * auVar37._52_4_;
          bVar6 = (bool)(bVar11 >> 6 & 1);
          auVar40._56_4_ = (uint)bVar6 * auVar35._56_4_ | (uint)!bVar6 * auVar37._56_4_;
          auVar40._60_4_ =
               (uint)(bVar11 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
          auVar26 = vextracti64x4_avx512f(auVar40,1);
          auVar35 = vpmulld_avx512f(auVar40,ZEXT3264(auVar26));
          auVar7 = vpmulld_avx(auVar35._0_16_,auVar35._16_16_);
          auVar8 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          auVar8 = vpshufd_avx(auVar7,0x55);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          iVar45 = auVar7._0_4_;
        }
        iVar46 = 1;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar5->d).d[1];
        if (uVar15 < 2) {
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        uVar15 = (dEdf->d).nd;
        if ((ulong)uVar15 != 0) {
          auVar35 = vpbroadcastq_avx512f();
          uVar14 = 0;
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar37 = vmovdqa64_avx512f(auVar36);
            auVar36 = vpbroadcastq_avx512f();
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar9 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar10 = (byte)uVar9;
            uVar9 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar11 = (byte)uVar9;
            uVar25 = CONCAT11(bVar11,bVar10);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar14));
            auVar41._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar36._4_4_;
            auVar41._0_4_ = (uint)(bVar10 & 1) * auVar36._0_4_;
            auVar41._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar36._8_4_;
            auVar41._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar36._12_4_;
            auVar41._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar36._16_4_;
            auVar41._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar36._20_4_;
            auVar41._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar36._24_4_;
            auVar41._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar36._28_4_;
            auVar41._32_4_ = (uint)(bVar11 & 1) * auVar36._32_4_;
            auVar41._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar36._36_4_;
            auVar41._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar36._40_4_;
            auVar41._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar36._44_4_;
            auVar41._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar36._48_4_;
            auVar41._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar36._52_4_;
            auVar41._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar36._56_4_;
            auVar41._60_4_ = (uint)(bVar11 >> 7) * auVar36._60_4_;
            auVar36 = vpmulld_avx512f(auVar41,auVar37);
            uVar14 = uVar14 + 0x10;
          } while (((ulong)uVar15 + 0xf & 0x1fffffff0) != uVar14);
          auVar35 = vmovdqa32_avx512f(auVar36);
          auVar42._0_4_ =
               (uint)(bVar10 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar6 * auVar35._4_4_ | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar6 * auVar35._8_4_ | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * auVar37._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar42._16_4_ = (uint)bVar6 * auVar35._16_4_ | (uint)!bVar6 * auVar37._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar42._20_4_ = (uint)bVar6 * auVar35._20_4_ | (uint)!bVar6 * auVar37._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar42._24_4_ = (uint)bVar6 * auVar35._24_4_ | (uint)!bVar6 * auVar37._24_4_;
          bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar42._28_4_ = (uint)bVar6 * auVar35._28_4_ | (uint)!bVar6 * auVar37._28_4_;
          auVar42._32_4_ =
               (uint)(bVar11 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
          bVar6 = (bool)(bVar11 >> 1 & 1);
          auVar42._36_4_ = (uint)bVar6 * auVar35._36_4_ | (uint)!bVar6 * auVar37._36_4_;
          bVar6 = (bool)(bVar11 >> 2 & 1);
          auVar42._40_4_ = (uint)bVar6 * auVar35._40_4_ | (uint)!bVar6 * auVar37._40_4_;
          bVar6 = (bool)(bVar11 >> 3 & 1);
          auVar42._44_4_ = (uint)bVar6 * auVar35._44_4_ | (uint)!bVar6 * auVar37._44_4_;
          bVar6 = (bool)(bVar11 >> 4 & 1);
          auVar42._48_4_ = (uint)bVar6 * auVar35._48_4_ | (uint)!bVar6 * auVar37._48_4_;
          bVar6 = (bool)(bVar11 >> 5 & 1);
          auVar42._52_4_ = (uint)bVar6 * auVar35._52_4_ | (uint)!bVar6 * auVar37._52_4_;
          bVar6 = (bool)(bVar11 >> 6 & 1);
          auVar42._56_4_ = (uint)bVar6 * auVar35._56_4_ | (uint)!bVar6 * auVar37._56_4_;
          auVar42._60_4_ =
               (uint)(bVar11 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
          auVar26 = vextracti64x4_avx512f(auVar42,1);
          auVar35 = vpmulld_avx512f(auVar42,ZEXT3264(auVar26));
          auVar7 = vpmulld_avx(auVar35._0_16_,auVar35._16_16_);
          auVar8 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          auVar8 = vpshufd_avx(auVar7,0x55);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          iVar46 = auVar7._0_4_;
        }
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar5->v + (uVar23 % (pTVar5->d).bd) * iVar45;
        uVar2 = (pTVar5->d).d[0];
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar2;
        local_78.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar23 % (dEdf->d).bd) * iVar46;
        uVar16 = (dEdf->d).d[0];
        local_78.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar16;
        local_78.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(dEdf->d).d[1];
        if (uVar15 < 2) {
          local_78.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if (uVar2 != uVar16) goto LAB_00183419;
        uVar15 = (dEdxi->d).nd;
        if ((ulong)uVar15 == 0) {
          iVar45 = 1;
        }
        else {
          auVar35 = vpbroadcastq_avx512f();
          uVar14 = 0;
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar37 = vmovdqa64_avx512f(auVar36);
            auVar36 = vpbroadcastq_avx512f();
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar9 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar10 = (byte)uVar9;
            uVar9 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar11 = (byte)uVar9;
            uVar25 = CONCAT11(bVar11,bVar10);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar14));
            auVar43._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar36._4_4_;
            auVar43._0_4_ = (uint)(bVar10 & 1) * auVar36._0_4_;
            auVar43._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar36._8_4_;
            auVar43._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar36._12_4_;
            auVar43._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar36._16_4_;
            auVar43._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar36._20_4_;
            auVar43._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar36._24_4_;
            auVar43._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar36._28_4_;
            auVar43._32_4_ = (uint)(bVar11 & 1) * auVar36._32_4_;
            auVar43._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar36._36_4_;
            auVar43._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar36._40_4_;
            auVar43._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar36._44_4_;
            auVar43._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar36._48_4_;
            auVar43._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar36._52_4_;
            auVar43._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar36._56_4_;
            auVar43._60_4_ = (uint)(bVar11 >> 7) * auVar36._60_4_;
            auVar36 = vpmulld_avx512f(auVar43,auVar37);
            uVar14 = uVar14 + 0x10;
          } while (((ulong)uVar15 + 0xf & 0x1fffffff0) != uVar14);
          auVar33 = vmovdqa32_avx512f(auVar36);
          auVar44._0_4_ =
               (uint)(bVar10 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar44._4_4_ = (uint)bVar6 * auVar33._4_4_ | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar44._8_4_ = (uint)bVar6 * auVar33._8_4_ | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar44._12_4_ = (uint)bVar6 * auVar33._12_4_ | (uint)!bVar6 * auVar37._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar44._16_4_ = (uint)bVar6 * auVar33._16_4_ | (uint)!bVar6 * auVar37._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar44._20_4_ = (uint)bVar6 * auVar33._20_4_ | (uint)!bVar6 * auVar37._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar44._24_4_ = (uint)bVar6 * auVar33._24_4_ | (uint)!bVar6 * auVar37._24_4_;
          bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar44._28_4_ = (uint)bVar6 * auVar33._28_4_ | (uint)!bVar6 * auVar37._28_4_;
          auVar44._32_4_ =
               (uint)(bVar11 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
          bVar6 = (bool)(bVar11 >> 1 & 1);
          auVar44._36_4_ = (uint)bVar6 * auVar33._36_4_ | (uint)!bVar6 * auVar37._36_4_;
          bVar6 = (bool)(bVar11 >> 2 & 1);
          auVar44._40_4_ = (uint)bVar6 * auVar33._40_4_ | (uint)!bVar6 * auVar37._40_4_;
          bVar6 = (bool)(bVar11 >> 3 & 1);
          auVar44._44_4_ = (uint)bVar6 * auVar33._44_4_ | (uint)!bVar6 * auVar37._44_4_;
          bVar6 = (bool)(bVar11 >> 4 & 1);
          auVar44._48_4_ = (uint)bVar6 * auVar33._48_4_ | (uint)!bVar6 * auVar37._48_4_;
          bVar6 = (bool)(bVar11 >> 5 & 1);
          auVar44._52_4_ = (uint)bVar6 * auVar33._52_4_ | (uint)!bVar6 * auVar37._52_4_;
          bVar6 = (bool)(bVar11 >> 6 & 1);
          auVar44._56_4_ = (uint)bVar6 * auVar33._56_4_ | (uint)!bVar6 * auVar37._56_4_;
          auVar44._60_4_ =
               (uint)(bVar11 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
          auVar26 = vextracti64x4_avx512f(auVar44,1);
          auVar33 = vpmulld_avx512f(auVar44,ZEXT3264(auVar26));
          auVar7 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
          auVar8 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          auVar8 = vpshufd_avx(auVar7,0x55);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          iVar45 = auVar7._0_4_;
        }
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar23 % (dEdxi->d).bd) * iVar45;
        uVar2 = (dEdxi->d).d[0];
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar2;
        uVar16 = (dEdxi->d).d[1];
        if (uVar15 < 2) {
          uVar16 = 1;
        }
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar16;
        if ((uVar2 != (uint)local_98.
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_cols.m_value) ||
           (local_78.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value !=
            local_b8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value)) goto LAB_0018343b;
        Eigen::internal::
        generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_b8,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_98,&local_78);
        uVar23 = uVar23 + 1;
        auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      } while (uVar23 != uVar12);
    }
  }
  else {
    uVar23 = (dEdf->d).bd;
    uVar12 = (ppTVar3[i + 1]->d).bd;
    if (uVar12 < uVar23) {
      uVar12 = uVar23;
    }
    if (0 < (int)uVar12) {
      uVar23 = 0;
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        uVar24 = (dEdf->d).nd;
        iVar45 = 1;
        if ((ulong)uVar24 != 0) {
          auVar35 = vpbroadcastq_avx512f();
          uVar14 = 0;
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar37 = vmovdqa64_avx512f(auVar36);
            auVar36 = vpbroadcastq_avx512f();
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar9 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar10 = (byte)uVar9;
            uVar9 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar11 = (byte)uVar9;
            uVar25 = CONCAT11(bVar11,bVar10);
            auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar14));
            auVar36._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar38._4_4_;
            auVar36._0_4_ = (uint)(bVar10 & 1) * auVar38._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar38._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar38._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar38._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar38._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar38._24_4_;
            auVar36._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar38._28_4_;
            auVar36._32_4_ = (uint)(bVar11 & 1) * auVar38._32_4_;
            auVar36._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar38._36_4_;
            auVar36._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar38._40_4_;
            auVar36._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar38._44_4_;
            auVar36._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar38._48_4_;
            auVar36._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar38._52_4_;
            auVar36._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar38._56_4_;
            auVar36._60_4_ = (uint)(bVar11 >> 7) * auVar38._60_4_;
            auVar36 = vpmulld_avx512f(auVar36,auVar37);
            uVar14 = uVar14 + 0x10;
          } while (((ulong)uVar24 + 0xf & 0x1fffffff0) != uVar14);
          auVar36 = vmovdqa32_avx512f(auVar36);
          auVar35._0_4_ =
               (uint)(bVar10 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar6 * auVar36._4_4_ | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar6 * auVar36._8_4_ | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar6 * auVar36._12_4_ | (uint)!bVar6 * auVar37._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar35._16_4_ = (uint)bVar6 * auVar36._16_4_ | (uint)!bVar6 * auVar37._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar35._20_4_ = (uint)bVar6 * auVar36._20_4_ | (uint)!bVar6 * auVar37._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar35._24_4_ = (uint)bVar6 * auVar36._24_4_ | (uint)!bVar6 * auVar37._24_4_;
          bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar35._28_4_ = (uint)bVar6 * auVar36._28_4_ | (uint)!bVar6 * auVar37._28_4_;
          auVar35._32_4_ =
               (uint)(bVar11 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
          bVar6 = (bool)(bVar11 >> 1 & 1);
          auVar35._36_4_ = (uint)bVar6 * auVar36._36_4_ | (uint)!bVar6 * auVar37._36_4_;
          bVar6 = (bool)(bVar11 >> 2 & 1);
          auVar35._40_4_ = (uint)bVar6 * auVar36._40_4_ | (uint)!bVar6 * auVar37._40_4_;
          bVar6 = (bool)(bVar11 >> 3 & 1);
          auVar35._44_4_ = (uint)bVar6 * auVar36._44_4_ | (uint)!bVar6 * auVar37._44_4_;
          bVar6 = (bool)(bVar11 >> 4 & 1);
          auVar35._48_4_ = (uint)bVar6 * auVar36._48_4_ | (uint)!bVar6 * auVar37._48_4_;
          bVar6 = (bool)(bVar11 >> 5 & 1);
          auVar35._52_4_ = (uint)bVar6 * auVar36._52_4_ | (uint)!bVar6 * auVar37._52_4_;
          bVar6 = (bool)(bVar11 >> 6 & 1);
          auVar35._56_4_ = (uint)bVar6 * auVar36._56_4_ | (uint)!bVar6 * auVar37._56_4_;
          auVar35._60_4_ =
               (uint)(bVar11 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
          auVar26 = vextracti64x4_avx512f(auVar35,1);
          auVar35 = vpmulld_avx512f(auVar35,ZEXT3264(auVar26));
          auVar7 = vpmulld_avx(auVar35._0_16_,auVar35._16_16_);
          auVar8 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          auVar8 = vpshufd_avx(auVar7,0x55);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          iVar45 = auVar7._0_4_;
        }
        iVar46 = 1;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(dEdf->d).d[1];
        if (uVar24 < 2) {
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        pTVar5 = (local_58->
                 super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[i + 1];
        uVar24 = (pTVar5->d).nd;
        if ((ulong)uVar24 != 0) {
          auVar35 = vpbroadcastq_avx512f();
          uVar14 = 0;
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar37 = vmovdqa64_avx512f(auVar36);
            auVar36 = vpbroadcastq_avx512f();
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar9 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar10 = (byte)uVar9;
            uVar9 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar11 = (byte)uVar9;
            uVar25 = CONCAT11(bVar11,bVar10);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar5->d).d + uVar14));
            auVar27._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar36._4_4_;
            auVar27._0_4_ = (uint)(bVar10 & 1) * auVar36._0_4_;
            auVar27._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar36._8_4_;
            auVar27._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar36._12_4_;
            auVar27._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar36._16_4_;
            auVar27._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar36._20_4_;
            auVar27._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar36._24_4_;
            auVar27._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar36._28_4_;
            auVar27._32_4_ = (uint)(bVar11 & 1) * auVar36._32_4_;
            auVar27._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar36._36_4_;
            auVar27._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar36._40_4_;
            auVar27._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar36._44_4_;
            auVar27._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar36._48_4_;
            auVar27._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar36._52_4_;
            auVar27._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar36._56_4_;
            auVar27._60_4_ = (uint)(bVar11 >> 7) * auVar36._60_4_;
            auVar36 = vpmulld_avx512f(auVar27,auVar37);
            uVar14 = uVar14 + 0x10;
          } while (((ulong)uVar24 + 0xf & 0x1fffffff0) != uVar14);
          auVar35 = vmovdqa32_avx512f(auVar36);
          auVar28._0_4_ =
               (uint)(bVar10 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar28._4_4_ = (uint)bVar6 * auVar35._4_4_ | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar28._8_4_ = (uint)bVar6 * auVar35._8_4_ | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar28._12_4_ = (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * auVar37._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar28._16_4_ = (uint)bVar6 * auVar35._16_4_ | (uint)!bVar6 * auVar37._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar28._20_4_ = (uint)bVar6 * auVar35._20_4_ | (uint)!bVar6 * auVar37._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar28._24_4_ = (uint)bVar6 * auVar35._24_4_ | (uint)!bVar6 * auVar37._24_4_;
          bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar28._28_4_ = (uint)bVar6 * auVar35._28_4_ | (uint)!bVar6 * auVar37._28_4_;
          auVar28._32_4_ =
               (uint)(bVar11 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
          bVar6 = (bool)(bVar11 >> 1 & 1);
          auVar28._36_4_ = (uint)bVar6 * auVar35._36_4_ | (uint)!bVar6 * auVar37._36_4_;
          bVar6 = (bool)(bVar11 >> 2 & 1);
          auVar28._40_4_ = (uint)bVar6 * auVar35._40_4_ | (uint)!bVar6 * auVar37._40_4_;
          bVar6 = (bool)(bVar11 >> 3 & 1);
          auVar28._44_4_ = (uint)bVar6 * auVar35._44_4_ | (uint)!bVar6 * auVar37._44_4_;
          bVar6 = (bool)(bVar11 >> 4 & 1);
          auVar28._48_4_ = (uint)bVar6 * auVar35._48_4_ | (uint)!bVar6 * auVar37._48_4_;
          bVar6 = (bool)(bVar11 >> 5 & 1);
          auVar28._52_4_ = (uint)bVar6 * auVar35._52_4_ | (uint)!bVar6 * auVar37._52_4_;
          bVar6 = (bool)(bVar11 >> 6 & 1);
          auVar28._56_4_ = (uint)bVar6 * auVar35._56_4_ | (uint)!bVar6 * auVar37._56_4_;
          auVar28._60_4_ =
               (uint)(bVar11 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
          auVar26 = vextracti64x4_avx512f(auVar28,1);
          auVar35 = vpmulld_avx512f(auVar28,ZEXT3264(auVar26));
          auVar7 = vpmulld_avx(auVar35._0_16_,auVar35._16_16_);
          auVar8 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          auVar8 = vpshufd_avx(auVar7,0x55);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          iVar46 = auVar7._0_4_;
        }
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar23 % (dEdf->d).bd) * iVar45;
        uVar15 = (dEdf->d).d[0];
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar15;
        local_78.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar5->v + (uVar23 % (pTVar5->d).bd) * iVar46;
        local_78.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(pTVar5->d).d[0];
        local_78.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar5->d).d[1];
        if (uVar24 < 2) {
          local_78.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if ((int)local_98.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value !=
            (int)local_78.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value) {
          pcVar13 = 
          "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Option = 0]"
          ;
          goto LAB_0018342e;
        }
        uVar24 = (dEdxi->d).nd;
        if ((ulong)uVar24 == 0) {
          iVar45 = 1;
        }
        else {
          auVar35 = vpbroadcastq_avx512f();
          uVar14 = 0;
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar37 = vmovdqa64_avx512f(auVar36);
            auVar36 = vpbroadcastq_avx512f();
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar9 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar10 = (byte)uVar9;
            uVar9 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar11 = (byte)uVar9;
            uVar25 = CONCAT11(bVar11,bVar10);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar14));
            auVar29._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar36._4_4_;
            auVar29._0_4_ = (uint)(bVar10 & 1) * auVar36._0_4_;
            auVar29._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar36._8_4_;
            auVar29._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar36._12_4_;
            auVar29._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar36._16_4_;
            auVar29._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar36._20_4_;
            auVar29._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar36._24_4_;
            auVar29._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar36._28_4_;
            auVar29._32_4_ = (uint)(bVar11 & 1) * auVar36._32_4_;
            auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar36._36_4_;
            auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar36._40_4_;
            auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar36._44_4_;
            auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar36._48_4_;
            auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar36._52_4_;
            auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar36._56_4_;
            auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar36._60_4_;
            auVar36 = vpmulld_avx512f(auVar29,auVar37);
            uVar14 = uVar14 + 0x10;
          } while (((ulong)uVar24 + 0xf & 0x1fffffff0) != uVar14);
          auVar34 = vmovdqa32_avx512f(auVar36);
          auVar33._0_4_ =
               (uint)(bVar10 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar37._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar33._4_4_ = (uint)bVar6 * auVar34._4_4_ | (uint)!bVar6 * auVar37._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar33._8_4_ = (uint)bVar6 * auVar34._8_4_ | (uint)!bVar6 * auVar37._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar33._12_4_ = (uint)bVar6 * auVar34._12_4_ | (uint)!bVar6 * auVar37._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar33._16_4_ = (uint)bVar6 * auVar34._16_4_ | (uint)!bVar6 * auVar37._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar33._20_4_ = (uint)bVar6 * auVar34._20_4_ | (uint)!bVar6 * auVar37._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar33._24_4_ = (uint)bVar6 * auVar34._24_4_ | (uint)!bVar6 * auVar37._24_4_;
          bVar6 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar33._28_4_ = (uint)bVar6 * auVar34._28_4_ | (uint)!bVar6 * auVar37._28_4_;
          auVar33._32_4_ =
               (uint)(bVar11 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._32_4_;
          bVar6 = (bool)(bVar11 >> 1 & 1);
          auVar33._36_4_ = (uint)bVar6 * auVar34._36_4_ | (uint)!bVar6 * auVar37._36_4_;
          bVar6 = (bool)(bVar11 >> 2 & 1);
          auVar33._40_4_ = (uint)bVar6 * auVar34._40_4_ | (uint)!bVar6 * auVar37._40_4_;
          bVar6 = (bool)(bVar11 >> 3 & 1);
          auVar33._44_4_ = (uint)bVar6 * auVar34._44_4_ | (uint)!bVar6 * auVar37._44_4_;
          bVar6 = (bool)(bVar11 >> 4 & 1);
          auVar33._48_4_ = (uint)bVar6 * auVar34._48_4_ | (uint)!bVar6 * auVar37._48_4_;
          bVar6 = (bool)(bVar11 >> 5 & 1);
          auVar33._52_4_ = (uint)bVar6 * auVar34._52_4_ | (uint)!bVar6 * auVar37._52_4_;
          bVar6 = (bool)(bVar11 >> 6 & 1);
          auVar33._56_4_ = (uint)bVar6 * auVar34._56_4_ | (uint)!bVar6 * auVar37._56_4_;
          auVar33._60_4_ =
               (uint)(bVar11 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar37._60_4_;
          auVar26 = vextracti64x4_avx512f(auVar33,1);
          auVar33 = vpmulld_avx512f(auVar33,ZEXT3264(auVar26));
          auVar7 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
          auVar8 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          auVar8 = vpshufd_avx(auVar7,0x55);
          auVar7 = vpmulld_avx(auVar7,auVar8);
          iVar45 = auVar7._0_4_;
        }
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar23 % (dEdxi->d).bd) * iVar45;
        uVar2 = (dEdxi->d).d[0];
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar2;
        uVar16 = (dEdxi->d).d[1];
        if (uVar24 < 2) {
          uVar16 = 1;
        }
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar16;
        if ((uVar2 != uVar15) ||
           (local_78.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value !=
            local_b8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value)) {
          pcVar13 = 
          "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
          ;
          goto LAB_00183450;
        }
        Eigen::internal::
        generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_b8,&local_98,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_78);
        uVar23 = uVar23 + 1;
        auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      } while (uVar23 != uVar12);
    }
  }
  return;
}

Assistant:

void AffineTransform::backward_impl(const vector<const Tensor*>& xs,
                               const Tensor& fx,
                               const Tensor& dEdf,
                               unsigned i,
                               Tensor& dEdxi) const {
  assert(i < xs.size());
  if (i == 0) { // bias term
#if HAVE_CUDA
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, dEdxi.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v, 1));
#else
    assert(fx.d.bd == 1);
    // Add, using broadcasting or not
    if(dEdxi.d.bd > 1 && dEdf.d.bd == 1) {
      dEdxi.rowcol_matrix().colwise() += dEdf.vec();
    } else {
      for(unsigned b = 0; b < dEdxi.d.bd; ++b)
        dEdxi.batch_matrix(b) += dEdf.batch_matrix(b);
    }
#endif
  } else if (i % 2 == 1) { // left argument of matrix multiply
    int max_b = max(dEdf.d.bd, xs[i+1]->d.bd);
#if HAVE_CUDA
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
            kSCALAR_ONE,
            dEdf.batch_ptr(b), dEdf.d.rows(),
            xs[i+1]->batch_ptr(b), xs[i+1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
#else
    for(int b = 0; b < max_b; ++b)
      dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[i+1]->batch_matrix(b).transpose();
#endif
  } else {  // right argument of matrix multiply
    int max_b = max(xs[i-1]->d.bd, dEdf.d.bd);
#if HAVE_CUDA
    // TODO: Add reverse
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols(), xs[i-1]->d.rows(),
            kSCALAR_ONE,
            xs[i-1]->batch_ptr(b), xs[i-1]->d.rows(),
            dEdf.batch_ptr(b), xs[i-1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
#else
    if(xs[i-1]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[i-1]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[i-1]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
#endif
  }
}